

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandShowBdd(Abc_Frame_t *pAbc,int argc,char **argv)

{
  long *plVar1;
  bool bVar2;
  int iVar3;
  Abc_Ntk_t *pNtk;
  Abc_Ntk_t *pNtk_00;
  Abc_Obj_t *pNode;
  char *pcVar4;
  uint fCompl;
  char *pcVar5;
  
  pNtk = Abc_FrameReadNtk(pAbc);
  fCompl = 0;
  Extra_UtilGetoptReset();
  bVar2 = false;
  while( true ) {
    while (iVar3 = Extra_UtilGetopt(argc,argv,"cgh"), iVar3 == 0x67) {
      bVar2 = (bool)(bVar2 ^ 1);
    }
    if (iVar3 == -1) break;
    if (iVar3 != 99) {
      pcVar5 = "yes";
      if (!bVar2) {
        pcVar5 = "no";
      }
LAB_0024ed87:
      Abc_Print(-2,"usage: show_bdd [-cgh] <node>\n");
      Abc_Print(-2,"       uses DOT and GSVIEW to visualize the global BDDs of primary outputs\n");
      Abc_Print(-2,
                "       in terms of primary inputs or the local BDD of a node in terms of its fanins\n"
               );
      Abc_Print(-2,
                "\t<node>: (optional) the node to consider [default = the driver of the first PO]\n"
               );
      pcVar4 = "yes";
      if (fCompl == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-c    : toggle visualizing BDD with complemented edges [default = %s].\n",
                pcVar4);
      Abc_Print(-2,
                "\t-g    : toggle visualizing the global BDDs of primary outputs [default = %s].\n",
                pcVar5);
      pcVar5 = "\t-h    : print the command usage\n";
      iVar3 = -2;
LAB_0024ee9d:
      Abc_Print(iVar3,pcVar5);
      return 1;
    }
    fCompl = fCompl ^ 1;
  }
  if (pNtk == (Abc_Ntk_t *)0x0) {
    pcVar5 = "Empty network.\n";
  }
  else {
    if (bVar2) {
      if (pNtk->ntkType == ABC_NTK_STRASH) {
        Abc_NtkShowBdd(pNtk,fCompl);
        return 0;
      }
      pNtk_00 = Abc_NtkStrash(pNtk,0,0,0);
      Abc_NtkShowBdd(pNtk_00,fCompl);
      if (pNtk_00 != pNtk) {
        Abc_NtkDelete(pNtk_00);
        return 0;
      }
      return 0;
    }
    if ((pNtk->ntkFunc == ABC_FUNC_BDD) && (pNtk->ntkType == ABC_NTK_LOGIC)) {
      if (argc <= globalUtilOptind + 1) {
        if (globalUtilOptind == argc) {
          if (pNtk->vPos->nSize < 1) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          plVar1 = (long *)*pNtk->vPos->pArray;
          pNode = *(Abc_Obj_t **)
                   (*(long *)(*(long *)(*plVar1 + 0x20) + 8) + (long)*(int *)plVar1[4] * 8);
          if ((*(uint *)&pNode->field_0x14 & 0xf) == 7) {
LAB_0024ef1a:
            Abc_NodeShowBdd(pNode,fCompl);
            return 0;
          }
          pcVar5 = Abc_ObjName(pNode);
          pcVar4 = "The driver \"%s\" of the first PO is not an internal node.\n";
        }
        else {
          pNode = Abc_NtkFindNode(pNtk,argv[globalUtilOptind]);
          if (pNode != (Abc_Obj_t *)0x0) goto LAB_0024ef1a;
          pcVar5 = argv[globalUtilOptind];
          pcVar4 = "Cannot find node \"%s\".\n";
        }
        Abc_Print(-1,pcVar4,pcVar5);
        return 1;
      }
      Abc_Print(-1,"Wrong number of auguments.\n");
      pcVar5 = "no";
      goto LAB_0024ed87;
    }
    pcVar5 = "Visualizing BDDs can only be done for logic BDD networks (run \"bdd\").\n";
  }
  iVar3 = -1;
  goto LAB_0024ee9d;
}

Assistant:

int Abc_CommandShowBdd( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    Abc_Obj_t * pNode;
    int c, fCompl = 0, fGlobal = 0;
    extern void Abc_NodeShowBdd( Abc_Obj_t * pNode, int fCompl );
    extern void Abc_NtkShowBdd( Abc_Ntk_t * pNtk, int fCompl );

    // set defaults
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "cgh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'c':
            fCompl ^= 1;
            break;
        case 'g':
            fGlobal ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }

    if ( fGlobal )
    {
        Abc_Ntk_t * pTemp = Abc_NtkIsStrash(pNtk) ? pNtk : Abc_NtkStrash(pNtk, 0, 0, 0);
        Abc_NtkShowBdd( pTemp, fCompl );
        if ( pTemp != pNtk )
            Abc_NtkDelete( pTemp );
        return 0;
    }

    if ( !Abc_NtkIsBddLogic(pNtk) )
    {
        Abc_Print( -1, "Visualizing BDDs can only be done for logic BDD networks (run \"bdd\").\n" );
        return 1;
    }
    if ( argc > globalUtilOptind + 1 )
    {
        Abc_Print( -1, "Wrong number of auguments.\n" );
        goto usage;
    }
    if ( argc == globalUtilOptind )
    {
        pNode = Abc_ObjFanin0( Abc_NtkPo(pNtk, 0) );
        if ( !Abc_ObjIsNode(pNode) )
        {
            Abc_Print( -1, "The driver \"%s\" of the first PO is not an internal node.\n", Abc_ObjName(pNode) );
            return 1;
        }
    }
    else
    {
        pNode = Abc_NtkFindNode( pNtk, argv[globalUtilOptind] );
        if ( pNode == NULL )
        {
            Abc_Print( -1, "Cannot find node \"%s\".\n", argv[globalUtilOptind] );
            return 1;
        }
    }
    Abc_NodeShowBdd( pNode, fCompl );
    return 0;

usage:
    Abc_Print( -2, "usage: show_bdd [-cgh] <node>\n" );
    Abc_Print( -2, "       uses DOT and GSVIEW to visualize the global BDDs of primary outputs\n" );
    Abc_Print( -2, "       in terms of primary inputs or the local BDD of a node in terms of its fanins\n" );
#ifdef WIN32
    Abc_Print( -2, "       \"dot.exe\" and \"gsview32.exe\" should be set in the paths\n" );
    Abc_Print( -2, "       (\"gsview32.exe\" may be in \"C:\\Program Files\\Ghostgum\\gsview\\\")\n" );
#endif
    Abc_Print( -2, "\t<node>: (optional) the node to consider [default = the driver of the first PO]\n");
    Abc_Print( -2, "\t-c    : toggle visualizing BDD with complemented edges [default = %s].\n", fCompl? "yes": "no" );
    Abc_Print( -2, "\t-g    : toggle visualizing the global BDDs of primary outputs [default = %s].\n", fGlobal? "yes": "no" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    return 1;
}